

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_0,_3,_0,_9>::evaluate
               (ShaderEvalContext *evalCtx)

{
  Vector<float,_3> local_84;
  tcu local_78 [12];
  Vector<float,_3> local_6c;
  VecAccess<float,_4,_3> local_60;
  Matrix<float,_3,_3> local_44;
  
  tcu::Vector<float,_3>::Vector(&local_84,(Vector<float,_3> *)s_constInVec3);
  tcu::Matrix<float,_3,_3>::Matrix(&local_44,(Matrix<float,_3,_3> *)(s_constInMat3 + 0x24));
  tcu::operator*(local_78,&local_84,&local_44);
  tcu::Vector<float,_3>::Vector(&local_6c,(Vector<float,_3> *)local_78);
  local_60.m_vector = &evalCtx->color;
  local_60.m_index[0] = 0;
  local_60.m_index[1] = 1;
  local_60.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_60,&local_6c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}